

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O3

int Cbs2_ManAnalyze(Cbs2_Man_t *p,int Level,int iVar,int iFan0,int iFan1)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  int iVar4;
  int *piVar5;
  int *__ptr;
  int iVar6;
  ulong uVar7;
  
  if ((-1 < iVar) && (iVar < (p->vAssign).nSize)) {
    if ('\x01' < (p->vAssign).pArray[(uint)iVar]) {
      __assert_fail("Cbs2_VarIsAssigned(p, iVar)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                    ,0x310,"int Cbs2_ManAnalyze(Cbs2_Man_t *, int, int, int, int)");
    }
    iVar4 = (p->pClauses).iHead;
    if (iVar4 != (p->pClauses).iTail) {
      __assert_fail("Cbs2_QueIsEmpty( pQue )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                    ,0x311,"int Cbs2_ManAnalyze(Cbs2_Man_t *, int, int, int, int)");
    }
    if (iVar4 == (p->pClauses).nSize) {
      (p->pClauses).nSize = iVar4 * 2;
      piVar5 = (p->pClauses).pData;
      if (piVar5 == (int *)0x0) {
        piVar5 = (int *)malloc((long)iVar4 << 3);
      }
      else {
        piVar5 = (int *)realloc(piVar5,(long)iVar4 << 3);
        iVar4 = (p->pClauses).iTail;
      }
      (p->pClauses).pData = piVar5;
    }
    else {
      piVar5 = (p->pClauses).pData;
    }
    (p->pClauses).iTail = iVar4 + 1;
    piVar5[iVar4] = 0;
    iVar4 = (p->pClauses).iTail;
    if (iVar4 == (p->pClauses).nSize) {
      (p->pClauses).nSize = iVar4 * 2;
      piVar5 = (int *)realloc(piVar5,(long)iVar4 << 3);
      iVar4 = (p->pClauses).iTail;
      (p->pClauses).pData = piVar5;
    }
    (p->pClauses).iTail = iVar4 + 1;
    piVar5[iVar4] = 0;
    if (iFan0 == 0) {
      if (iFan1 == 0) {
        __assert_fail("iFan1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                      ,800,"int Cbs2_ManAnalyze(Cbs2_Man_t *, int, int, int, int)");
      }
      uVar1 = piVar5[iFan1];
      iVar6 = (p->pClauses).iTail + uVar1;
      iVar4 = (p->pClauses).nSize;
      if (iVar4 < iVar6) {
        (p->pClauses).nSize = iVar4 * 2;
        piVar5 = (int *)realloc(piVar5,(long)iVar4 << 3);
        iVar4 = (p->pClauses).nSize;
        iVar6 = (p->pClauses).iTail + uVar1;
        (p->pClauses).pData = piVar5;
      }
      if (iVar4 < iVar6) {
        __assert_fail("p->iTail + Plus <= p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                      ,0x180,"void Cbs2_QueGrow(Cbs2_Que_t *, int)");
      }
      piVar5 = (p->pClauses).pData;
      uVar2 = piVar5[(long)iFan1 + 1];
      if ((int)uVar2 < 0) {
LAB_007289bd:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      if (uVar2 >> 1 != iVar) {
        __assert_fail("iVar == Abc_Lit2Var(pLits[0])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                      ,0x323,"int Cbs2_ManAnalyze(Cbs2_Man_t *, int, int, int, int)");
      }
      if ((p->vAssign).nSize <= iVar) goto LAB_007289dc;
      if ((uVar2 & 1) != (int)(p->vAssign).pArray[(uint)iVar]) {
        __assert_fail("Cbs2_VarValue(p, iVar) == Abc_LitIsCompl(pLits[0])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                      ,0x324,"int Cbs2_ManAnalyze(Cbs2_Man_t *, int, int, int, int)");
      }
      if (0 < (int)uVar1) {
        uVar7 = 0;
        __ptr = piVar5;
        do {
          uVar2 = piVar5[(long)iFan1 + uVar7 + 1];
          if ((int)uVar2 < 0) goto LAB_007289bd;
          iVar4 = (p->pClauses).iTail;
          if (iVar4 == (p->pClauses).nSize) {
            (p->pClauses).nSize = iVar4 * 2;
            __ptr = (int *)realloc(__ptr,(long)iVar4 << 3);
            iVar4 = (p->pClauses).iTail;
            (p->pClauses).pData = __ptr;
          }
          (p->pClauses).iTail = iVar4 + 1;
          __ptr[iVar4] = uVar2 >> 1;
          uVar7 = uVar7 + 1;
        } while (uVar1 != uVar7);
      }
    }
    else {
      if ((iFan0 < 0) || (uVar1 = (p->vAssign).nSize, (int)uVar1 <= iFan0)) goto LAB_007289dc;
      pcVar3 = (p->vAssign).pArray;
      if ('\x01' < pcVar3[(uint)iFan0]) {
        __assert_fail("Cbs2_VarIsAssigned(p, iFan0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                      ,0x316,"int Cbs2_ManAnalyze(Cbs2_Man_t *, int, int, int, int)");
      }
      if (iFan1 != 0) {
        if ((iFan1 < 0) || (uVar1 <= (uint)iFan1)) goto LAB_007289dc;
        if ('\x01' < pcVar3[(uint)iFan1]) {
          __assert_fail("iFan1 == 0 || Cbs2_VarIsAssigned(p, iFan1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                        ,0x317,"int Cbs2_ManAnalyze(Cbs2_Man_t *, int, int, int, int)");
        }
      }
      iVar4 = (p->pClauses).iTail;
      if (iVar4 == (p->pClauses).nSize) {
        (p->pClauses).nSize = iVar4 * 2;
        piVar5 = (int *)realloc(piVar5,(long)iVar4 << 3);
        iVar4 = (p->pClauses).iTail;
        (p->pClauses).pData = piVar5;
      }
      (p->pClauses).iTail = iVar4 + 1;
      piVar5[iVar4] = iVar;
      iVar4 = (p->pClauses).iTail;
      if (iVar4 == (p->pClauses).nSize) {
        (p->pClauses).nSize = iVar4 * 2;
        piVar5 = (int *)realloc(piVar5,(long)iVar4 << 3);
        iVar4 = (p->pClauses).iTail;
        (p->pClauses).pData = piVar5;
      }
      (p->pClauses).iTail = iVar4 + 1;
      piVar5[iVar4] = iFan0;
      if (iFan1 != 0) {
        iVar4 = (p->pClauses).iTail;
        if (iVar4 == (p->pClauses).nSize) {
          (p->pClauses).nSize = iVar4 * 2;
          piVar5 = (int *)realloc(piVar5,(long)iVar4 << 3);
          iVar4 = (p->pClauses).iTail;
          (p->pClauses).pData = piVar5;
        }
        (p->pClauses).iTail = iVar4 + 1;
        piVar5[iVar4] = iFan1;
      }
    }
    iVar4 = Cbs2_ManDeriveReason(p,Level);
    return iVar4;
  }
LAB_007289dc:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
}

Assistant:

static inline int Cbs2_ManAnalyze( Cbs2_Man_t * p, int Level, int iVar, int iFan0, int iFan1 )
{
    Cbs2_Que_t * pQue = &(p->pClauses); 
    assert( Cbs2_VarIsAssigned(p, iVar) );
    assert( Cbs2_QueIsEmpty( pQue ) );
    Cbs2_QuePush( pQue, 0 );
    Cbs2_QuePush( pQue, 0 );
    if ( iFan0 ) // circuit conflict
    {
        assert( Cbs2_VarIsAssigned(p, iFan0) );
        assert( iFan1 == 0 || Cbs2_VarIsAssigned(p, iFan1) );
        Cbs2_QuePush( pQue, iVar );
        Cbs2_QuePush( pQue, iFan0 );
        if ( iFan1 )
        Cbs2_QuePush( pQue, iFan1 );
    }
    else // clause conflict
    {
        int i, * pLits, nLits = Cbs2_ClauseSize( p, iFan1 );
        assert( iFan1 );
        Cbs2_QueGrow( pQue, nLits );
        pLits = Cbs2_ClauseLits( p, iFan1 );
        assert( iVar == Abc_Lit2Var(pLits[0]) );
        assert( Cbs2_VarValue(p, iVar) == Abc_LitIsCompl(pLits[0]) );
        for ( i = 0; i < nLits; i++ )
            Cbs2_QuePush( pQue, Abc_Lit2Var(pLits[i]) );
    }
    return Cbs2_ManDeriveReason( p, Level );
}